

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O2

MessageOptions * __thiscall
google::protobuf::DescriptorProto::mutable_options(DescriptorProto *this)

{
  MessageOptions *pMVar1;
  
  *(byte *)&this->field_0 = *(byte *)&this->field_0 | 2;
  pMVar1 = _internal_mutable_options(this);
  return pMVar1;
}

Assistant:

inline ::google::protobuf::MessageOptions* DescriptorProto::mutable_options() ABSL_ATTRIBUTE_LIFETIME_BOUND {
  _impl_._has_bits_[0] |= 0x00000002u;
  ::google::protobuf::MessageOptions* _msg = _internal_mutable_options();
  // @@protoc_insertion_point(field_mutable:google.protobuf.DescriptorProto.options)
  return _msg;
}